

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O1

BaseState<true> * __thiscall
DefaultState<true>::Key
          (DefaultState<true> *this,Context<true> *ctx,char *str,SizeType length,bool param_4)

{
  int iVar1;
  BaseState<true> *pBVar2;
  stringstream *psVar3;
  size_t sVar4;
  
  ctx->key = str;
  ctx->key_length = length;
  if (length == 0) {
    return &this->super_BaseState<true>;
  }
  if (*str != '_') {
    return &this->super_BaseState<true>;
  }
  if ((length < 6) || (iVar1 = strncmp(str,"_label",6), iVar1 != 0)) {
    if (length == 4) {
      iVar1 = strcasecmp(str,"_tag");
      if (iVar1 == 0) {
        return &(ctx->tag_state).super_BaseState<true>;
      }
    }
    else if (length == 6) {
      iVar1 = strcmp(str,"_multi");
      if (iVar1 == 0) {
        return &(ctx->multi_state).super_BaseState<true>;
      }
    }
    else if ((length == 5) && (iVar1 = strcmp(str,"_text"), iVar1 == 0)) {
      return &(ctx->text_state).super_BaseState<true>;
    }
    pBVar2 = Ignore(this,ctx,length);
    return pBVar2;
  }
  if (length == 6) {
LAB_001b4b6a:
    pBVar2 = &(ctx->label_state).super_BaseState<true>;
  }
  else {
    if (str[6] == '_') {
      return &(ctx->label_single_property_state).super_BaseState<true>;
    }
    if (length == 0xb) {
      iVar1 = strcasecmp(str,"_labelIndex");
      if (iVar1 == 0) {
        return &(ctx->label_index_state).super_BaseState<true>;
      }
    }
    else if (length == 6) goto LAB_001b4b6a;
    psVar3 = Context<true>::error_abi_cxx11_(ctx);
    psVar3 = psVar3 + 0x10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar3,"Unsupported key \'",0x11);
    sVar4 = strlen(str);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar3,str,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar3,"\' len: ",7);
    std::ostream::_M_insert<unsigned_long>((ulong)psVar3);
    pBVar2 = (BaseState<true> *)0x0;
  }
  return pBVar2;
}

Assistant:

BaseState<audit>* Key(Context<audit>& ctx, const char* str, rapidjson::SizeType length, bool)
  {
    ctx.key = str;
    ctx.key_length = length;

    if (length > 0 && str[0] == '_')
    {
      // match _label*
      if (ctx.key_length >= 6 && !strncmp(str, "_label", 6))
      {
        if (ctx.key_length >= 7 && ctx.key[6] == '_')
          return &ctx.label_single_property_state;
        else if (ctx.key_length == 6)
          return &ctx.label_state;
        else if (ctx.key_length == 11 && !_stricmp(str, "_labelIndex"))
          return &ctx.label_index_state;
        else
        {
          ctx.error() << "Unsupported key '" << str << "' len: " << length;
          return nullptr;
        }
      }

      if (ctx.key_length == 5 && !strcmp(str, "_text"))
        return &ctx.text_state;

      // TODO: _multi in _multi...
      if (ctx.key_length == 6 && !strcmp(str, "_multi"))
        return &ctx.multi_state;

      if (ctx.key_length == 4 && !_stricmp(ctx.key, "_tag"))
        return &ctx.tag_state;

      return Ignore(ctx, length);
    }

    return this;
  }